

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  ulong uVar1;
  IResultCapture *pIVar2;
  double _durationInSeconds;
  undefined1 local_98 [8];
  SectionEndInfo endInfo;
  Section *this_local;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00195898;
  endInfo.durationInSeconds = (double)this;
  if ((this->m_sectionIncluded & 1U) != 0) {
    _durationInSeconds = Timer::getElapsedSeconds(&this->m_timer);
    SectionEndInfo::SectionEndInfo
              ((SectionEndInfo *)local_98,&this->m_info,&this->m_assertions,_durationInSeconds);
    uVar1 = std::uncaught_exception();
    if ((uVar1 & 1) == 0) {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[4])(pIVar2,local_98);
    }
    else {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[5])(pIVar2,local_98);
    }
    SectionEndInfo::~SectionEndInfo((SectionEndInfo *)local_98);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  NonCopyable::~NonCopyable(&this->super_NonCopyable);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }